

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O2

ANNpointArray annAllocPts(int n,int dim)

{
  ANNpointArray ppAVar1;
  ANNpoint pAVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  uVar3 = (ulong)(uint)n << 3;
  if (n < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  uVar4 = 0;
  if (0 < n) {
    uVar4 = (ulong)(uint)n;
  }
  ppAVar1 = (ANNpointArray)operator_new__(uVar3);
  uVar3 = (ulong)(uint)(n * dim) * 8;
  if (n * dim < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pAVar2 = (ANNpoint)operator_new__(uVar3);
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    ppAVar1[uVar5] = pAVar2;
    pAVar2 = pAVar2 + dim;
  }
  return ppAVar1;
}

Assistant:

ANNpointArray annAllocPts(int n, int dim)  // allocate n pts in dim
{
    ANNpointArray pa = new ANNpoint[n];  // allocate points
    ANNpoint p = new ANNcoord[n * dim];  // allocate space for coords
    for (int i = 0; i < n; i++) {
        pa[i] = &(p[i * dim]);
    }
    return pa;
}